

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovPlatform.cpp
# Opt level: O2

void __thiscall cov::Platform::~Platform(Platform *this)

{
  if (this->m_vkInstance != (VkInstance)0x0) {
    vkDestroyInstance(this->m_vkInstance,0);
  }
  std::__cxx11::string::~string((string *)&this->m_extensions);
  std::__cxx11::string::~string((string *)&this->m_vendor);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::__cxx11::string::~string((string *)&this->m_version);
  std::__cxx11::string::~string((string *)&this->m_profile);
  return;
}

Assistant:

Platform::~Platform()
{
    if (m_vkInstance != VK_NULL_HANDLE) vkDestroyInstance(m_vkInstance, nullptr);
}